

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  char *this_00;
  TextRange local_50;
  TextRange local_40;
  char *local_30;
  char *we;
  char *wb;
  ImVector<ImGuiTextFilter::TextRange> *out_local;
  TextRange *pTStack_10;
  char separator_local;
  TextRange *this_local;
  
  wb = (char *)out;
  out_local._7_1_ = separator;
  pTStack_10 = this;
  ImVector<ImGuiTextFilter::TextRange>::resize(out,0);
  local_30 = this->b;
  we = local_30;
  for (; this_00 = wb, local_30 < this->e; local_30 = local_30 + 1) {
    if (*local_30 == out_local._7_1_) {
      TextRange(&local_40,we,local_30);
      ImVector<ImGuiTextFilter::TextRange>::push_back
                ((ImVector<ImGuiTextFilter::TextRange> *)this_00,&local_40);
      we = local_30 + 1;
    }
  }
  if (we != local_30) {
    TextRange(&local_50,we,local_30);
    ImVector<ImGuiTextFilter::TextRange>::push_back
              ((ImVector<ImGuiTextFilter::TextRange> *)this_00,&local_50);
  }
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}